

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_add(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *str;
  any *in_RCX;
  proxy *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  runtime_error *this_00;
  numeric *in_stack_ffffffffffffff18;
  type_info *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined1 local_b9 [41];
  numeric *in_stack_ffffffffffffff70;
  numeric *in_stack_ffffffffffffff78;
  any *in_stack_ffffffffffffff90;
  string local_68 [72];
  any *local_20;
  
  local_20 = in_RCX;
  cs_impl::any::type((any *)in_stack_ffffffffffffff10);
  bVar1 = std::type_info::operator==
                    (in_stack_ffffffffffffff20,(type_info *)in_stack_ffffffffffffff18);
  if (bVar1) {
    cs_impl::any::type((any *)in_stack_ffffffffffffff10);
    bVar1 = std::type_info::operator==
                      (in_stack_ffffffffffffff20,(type_info *)in_stack_ffffffffffffff18);
    if (bVar1) {
      cs_impl::any::const_val<cs::numeric>(in_stack_ffffffffffffff90);
      cs_impl::any::const_val<cs::numeric>(in_stack_ffffffffffffff90);
      numeric::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      cs_impl::any::any<cs::numeric>((any *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      return (var)in_RDI;
    }
  }
  cs_impl::any::type((any *)in_stack_ffffffffffffff10);
  bVar1 = std::type_info::operator==
                    (in_stack_ffffffffffffff20,(type_info *)in_stack_ffffffffffffff18);
  if ((bVar1) && (bVar1 = cs_impl::any::usable(local_20), bVar1)) {
    __lhs = cs_impl::any::const_val<std::__cxx11::string>(in_stack_ffffffffffffff90);
    cs_impl::any::to_string_abi_cxx11_((any *)in_RDI);
    std::operator+(__lhs,in_stack_ffffffffffffff10);
    cs_impl::any::make<std::__cxx11::string,std::__cxx11::string>(in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    return (var)in_RDI;
  }
  str = (string *)__cxa_allocate_exception(0x28);
  this_00 = (runtime_error *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_b9 + 1),"Unsupported operator operations(Add).",(allocator *)this_00);
  runtime_error::runtime_error(this_00,str);
  __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_add(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return a.const_val<numeric>() + b.const_val<numeric>();
		else if (a.type() == typeid(string) && b.usable())
			return var::make<std::string>(a.const_val<string>() + b.to_string());
		else
			throw runtime_error("Unsupported operator operations(Add).");
	}